

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::UniformBlockCase::UniformBlockCase
          (UniformBlockCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,GLSLVersion glslVersion,BufferMode bufferMode)

{
  bool bVar1;
  deBool dVar2;
  InternalError *this_00;
  GLSLVersion glslVersion_local;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  UniformBlockCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_032e6a20;
  this->m_renderCtx = renderCtx;
  this->m_glslVersion = glslVersion;
  this->m_bufferMode = bufferMode;
  ub::ShaderInterface::ShaderInterface(&this->m_interface);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = ub::isSupportedGLSLVersion(glslVersion), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      return;
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"isSupportedGLSLVersion(glslVersion)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
             ,0x56a);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

UniformBlockCase::UniformBlockCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, glu::GLSLVersion glslVersion, BufferMode bufferMode)
	: TestCase		(testCtx, name, description)
	, m_renderCtx	(renderCtx)
	, m_glslVersion	(glslVersion)
	, m_bufferMode	(bufferMode)
{
	TCU_CHECK_INTERNAL(isSupportedGLSLVersion(glslVersion));
}